

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

void __thiscall
VmaVirtualBlock_T::VmaVirtualBlock_T(VmaVirtualBlock_T *this,VmaVirtualBlockCreateInfo *createInfo)

{
  VkAllocationCallbacks *pVVar1;
  void *pvVar2;
  PFN_vkAllocationFunction p_Var3;
  PFN_vkReallocationFunction p_Var4;
  PFN_vkFreeFunction p_Var5;
  PFN_vkInternalFreeNotification p_Var6;
  VmaBlockMetadata_TLSF *this_00;
  undefined **ppuVar7;
  VkAllocationCallbacks *pVVar8;
  VkAllocationCallbacks *pAllocationCallbacks;
  bool bVar9;
  
  pVVar1 = createInfo->pAllocationCallbacks;
  pAllocationCallbacks = &this->m_AllocationCallbacks;
  bVar9 = pVVar1 != (VkAllocationCallbacks *)0x0;
  this->m_AllocationCallbacksSpecified = bVar9;
  pVVar8 = &VmaEmptyAllocationCallbacks;
  if (bVar9) {
    pVVar8 = pVVar1;
  }
  pvVar2 = pVVar8->pUserData;
  p_Var3 = pVVar8->pfnAllocation;
  p_Var4 = pVVar8->pfnReallocation;
  p_Var5 = pVVar8->pfnFree;
  p_Var6 = pVVar8->pfnInternalFree;
  (this->m_AllocationCallbacks).pfnInternalAllocation = pVVar8->pfnInternalAllocation;
  (this->m_AllocationCallbacks).pfnInternalFree = p_Var6;
  (this->m_AllocationCallbacks).pfnReallocation = p_Var4;
  (this->m_AllocationCallbacks).pfnFree = p_Var5;
  (this->m_AllocationCallbacks).pUserData = pvVar2;
  (this->m_AllocationCallbacks).pfnAllocation = p_Var3;
  if (!bVar9) {
    pAllocationCallbacks = (VkAllocationCallbacks *)0x0;
  }
  if ((createInfo->flags & 1) == 0) {
    this_00 = (VmaBlockMetadata_TLSF *)VmaMalloc(pAllocationCallbacks,400,8);
    VmaBlockMetadata_TLSF::VmaBlockMetadata_TLSF(this_00,(VkAllocationCallbacks *)0x0,1,true);
    ppuVar7 = (this_00->super_VmaBlockMetadata)._vptr_VmaBlockMetadata;
  }
  else {
    this_00 = (VmaBlockMetadata_TLSF *)VmaMalloc(pAllocationCallbacks,0x90,8);
    (this_00->super_VmaBlockMetadata).m_Size = 0;
    (this_00->super_VmaBlockMetadata).m_pAllocationCallbacks = (VkAllocationCallbacks *)0x0;
    (this_00->super_VmaBlockMetadata).m_BufferImageGranularity = 1;
    (this_00->super_VmaBlockMetadata).m_IsVirtual = true;
    ppuVar7 = &PTR__VmaBlockMetadata_Linear_00322f38;
    (this_00->super_VmaBlockMetadata)._vptr_VmaBlockMetadata =
         (_func_int **)&PTR__VmaBlockMetadata_Linear_00322f38;
    this_00->m_AllocCount = 0;
    this_00->m_BlocksFreeCount = 0;
    this_00->m_BlocksFreeSize = 0;
    this_00->m_IsFreeBitmap = 0;
    this_00->m_MemoryClasses = '\0';
    *(undefined3 *)&this_00->field_0x45 = 0;
    this_00->m_InnerIsFreeBitmap[0] = 0;
    this_00->m_InnerIsFreeBitmap[1] = 0;
    this_00->m_InnerIsFreeBitmap[2] = 0;
    this_00->m_InnerIsFreeBitmap[3] = 0;
    this_00->m_InnerIsFreeBitmap[4] = 0;
    this_00->m_InnerIsFreeBitmap[5] = 0;
    this_00->m_InnerIsFreeBitmap[6] = 0;
    this_00->m_InnerIsFreeBitmap[7] = 0;
    this_00->m_InnerIsFreeBitmap[8] = 0;
    this_00->m_InnerIsFreeBitmap[9] = 0;
    this_00->m_InnerIsFreeBitmap[10] = 0;
    this_00->m_InnerIsFreeBitmap[0xb] = 0;
    this_00->m_InnerIsFreeBitmap[0xc] = 0;
    this_00->m_InnerIsFreeBitmap[0xd] = 0;
    this_00->m_InnerIsFreeBitmap[0xe] = 0;
    this_00->m_InnerIsFreeBitmap[0xf] = 0;
    this_00->m_InnerIsFreeBitmap[0x10] = 0;
    this_00->m_InnerIsFreeBitmap[0x11] = 0;
  }
  this->m_Metadata = &this_00->super_VmaBlockMetadata;
  (*((_func_int **)ppuVar7)[2])(this_00,createInfo->size);
  return;
}

Assistant:

VmaVirtualBlock_T::VmaVirtualBlock_T(const VmaVirtualBlockCreateInfo& createInfo)
    : m_AllocationCallbacksSpecified(createInfo.pAllocationCallbacks != VMA_NULL),
    m_AllocationCallbacks(createInfo.pAllocationCallbacks != VMA_NULL ? *createInfo.pAllocationCallbacks : VmaEmptyAllocationCallbacks)
{
    const uint32_t algorithm = createInfo.flags & VMA_VIRTUAL_BLOCK_CREATE_ALGORITHM_MASK;
    switch (algorithm)
    {
    default:
        VMA_ASSERT(0);
    case 0:
        m_Metadata = vma_new(GetAllocationCallbacks(), VmaBlockMetadata_TLSF)(VK_NULL_HANDLE, 1, true);
        break;
    case VMA_VIRTUAL_BLOCK_CREATE_LINEAR_ALGORITHM_BIT:
        m_Metadata = vma_new(GetAllocationCallbacks(), VmaBlockMetadata_Linear)(VK_NULL_HANDLE, 1, true);
        break;
    }

    m_Metadata->Init(createInfo.size);
}